

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O2

iterator __thiscall Track::find(Track *this,Header *header)

{
  bool bVar1;
  Sector *rhs;
  long lVar2;
  long lVar3;
  Sector *pSVar4;
  
  rhs = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
        super__Vector_impl_data._M_start;
  pSVar4 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pSVar4 - (long)rhs;
  lVar2 = lVar3 >> 8;
  while( true ) {
    if (lVar2 < 1) {
      lVar3 = lVar3 >> 6;
      if (lVar3 != 1) {
        if (lVar3 != 2) {
          if (lVar3 != 3) {
            return (iterator)pSVar4;
          }
          bVar1 = Header::operator==(header,&rhs->header);
          if (bVar1) {
            return (iterator)rhs;
          }
          rhs = rhs + 1;
        }
        bVar1 = Header::operator==(header,&rhs->header);
        if (bVar1) {
          return (iterator)rhs;
        }
        rhs = rhs + 1;
      }
      bVar1 = Header::operator==(header,&rhs->header);
      if (bVar1) {
        pSVar4 = rhs;
      }
      return (iterator)pSVar4;
    }
    bVar1 = Header::operator==(header,&rhs->header);
    if (bVar1) {
      return (iterator)rhs;
    }
    bVar1 = Header::operator==(header,&rhs[1].header);
    if (bVar1) {
      return (iterator)(rhs + 1);
    }
    bVar1 = Header::operator==(header,&rhs[2].header);
    if (bVar1) {
      return (iterator)(rhs + 2);
    }
    bVar1 = Header::operator==(header,&rhs[3].header);
    if (bVar1) break;
    rhs = rhs + 4;
    lVar2 = lVar2 + -1;
    lVar3 = lVar3 + -0x100;
  }
  return (iterator)(rhs + 3);
}

Assistant:

std::vector<Sector>::iterator Track::find(const Header& header)
{
    return std::find_if(begin(), end(), [&](const Sector& s) {
        return header == s.header;
        });
}